

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O1

string * __thiscall
AwsCommandRunner::GetFullUrl(string *__return_storage_ptr__,AwsCommandRunner *this,string *path)

{
  size_type *psVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  string *psVar6;
  allocator local_61;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar6 = (string *)((this->local_path_)._M_string_length - 1);
  iVar2 = std::__cxx11::string::compare((ulong)path,0,psVar6,(ulong)&this->local_path_,0);
  if (iVar2 != 0) {
    __assert_fail("path.compare(0, strip_length, local_path_, 0, strip_length) == 0 && \"Path does not start with the required prefix\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner.cc"
                  ,0x35,"std::string AwsCommandRunner::GetFullUrl(const std::string &)");
  }
  std::operator+(&local_40,"s3://",&this->s3_bucket_);
  std::__cxx11::string::string((string *)&local_60,(string *)path,(ulong)psVar6,&local_61);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    uVar4 = local_40.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_58 + local_40._M_string_length) {
    uVar5 = 0xf;
    if (local_60 != local_50) {
      uVar5 = local_50[0];
    }
    if (local_58 + local_40._M_string_length <= uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_60,0,(char *)0x0,(ulong)local_40._M_dataplus._M_p);
      goto LAB_0017a0e4;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_0017a0e4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar4 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AwsCommandRunner::GetFullUrl(const std::string& path) {
  std::size_t strip_length = local_path_.size() - 1;
  assert(path.compare(0, strip_length, local_path_, 0, strip_length) == 0 &&
         "Path does not start with the required prefix");
  return "s3://" + s3_bucket_ + std::string(path, strip_length);
}